

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdApi.c
# Opt level: O2

void Cmd_CommandAdd(Abc_Frame_t *pAbc,char *sGroup,char *sName,Cmd_CommandFuncType pFunc,
                   int fChanges)

{
  int iVar1;
  char *value_00;
  char *key_00;
  char *pcVar2;
  char *value;
  char *key;
  
  key = sName;
  iVar1 = st__delete(pAbc->tCommands,&key,&value);
  if (iVar1 != 0) {
    fprintf((FILE *)pAbc->Err,"Cmd warning: redefining \'%s\'\n",sName);
    CmdCommandFree((Abc_Command *)value);
  }
  value_00 = (char *)malloc(0x20);
  key_00 = Extra_UtilStrsav(sName);
  *(char **)value_00 = key_00;
  pcVar2 = Extra_UtilStrsav(sGroup);
  *(char **)(value_00 + 8) = pcVar2;
  *(Cmd_CommandFuncType *)(value_00 + 0x10) = pFunc;
  *(int *)(value_00 + 0x18) = fChanges;
  iVar1 = st__insert(pAbc->tCommands,key_00,value_00);
  if (iVar1 == 0) {
    return;
  }
  __assert_fail("!fStatus",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cmd/cmdApi.c"
                ,0x55,
                "void Cmd_CommandAdd(Abc_Frame_t *, const char *, const char *, Cmd_CommandFuncType, int)"
               );
}

Assistant:

void Cmd_CommandAdd( Abc_Frame_t * pAbc, const char * sGroup, const char * sName, Cmd_CommandFuncType pFunc, int fChanges )
{
    const char * key;
    char * value;
    Abc_Command * pCommand;
    int fStatus;

    key = sName;
    if ( st__delete( pAbc->tCommands, &key, &value ) ) 
    {
        // delete existing definition for this command 
        fprintf( pAbc->Err, "Cmd warning: redefining '%s'\n", sName );
        CmdCommandFree( (Abc_Command *)value );
    }

    // create the new command
    pCommand = ABC_ALLOC( Abc_Command, 1 );
    pCommand->sName   = Extra_UtilStrsav( sName );
    pCommand->sGroup  = Extra_UtilStrsav( sGroup );
    pCommand->pFunc   = pFunc;
    pCommand->fChange = fChanges;
    fStatus = st__insert( pAbc->tCommands, pCommand->sName, (char *)pCommand );
    assert( !fStatus );  // the command should not be in the table
}